

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O2

bool_t memIsDisjoint4(void *buf1,size_t count1,void *buf2,size_t count2,void *buf3,size_t count3,
                     void *buf4,size_t count4)

{
  void *pvVar1;
  bool_t bVar2;
  
  pvVar1 = (void *)((long)buf1 + count1);
  if ((((count2 == 0 || count1 == 0) || pvVar1 <= buf2) || (void *)((long)buf2 + count2) <= buf1) &&
     (((count3 == 0 || count1 == 0) || pvVar1 <= buf3) || (void *)((long)buf3 + count3) <= buf1)) {
    if (((count4 == 0 || count1 == 0) || pvVar1 <= buf4) || (void *)((long)buf4 + count4) <= buf1) {
      bVar2 = memIsDisjoint3(buf2,count2,buf3,count3,buf4,count4);
      return bVar2;
    }
  }
  return 0;
}

Assistant:

bool_t memIsDisjoint4(const void* buf1, size_t count1,
	const void* buf2, size_t count2,
	const void* buf3, size_t count3,
	const void* buf4, size_t count4)
{
	return memIsDisjoint2(buf1, count1, buf2, count2) &&
		memIsDisjoint2(buf1, count1, buf3, count3) &&
		memIsDisjoint2(buf1, count1, buf4, count4) &&
		memIsDisjoint3(buf2, count2, buf3, count3, buf4, count4);
}